

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

SVectorBase<double> * __thiscall
soplex::LPRowSetBase<double>::create
          (LPRowSetBase<double> *this,DataKey *newkey,int nonzeros,double *newlhs,double *newrhs,
          double *newobj,int *newscaleExp)

{
  int iVar1;
  int iVar2;
  VectorBase<double> *this_00;
  double *pdVar3;
  SVSetBase<double> *this_01;
  DataArray<int> *this_02;
  int *piVar4;
  SVectorBase<double> *pSVar5;
  double *in_RCX;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  int *in_stack_00000008;
  int in_stack_ffffffffffffff5c;
  DataArray<int> *in_stack_ffffffffffffff60;
  int idxmax;
  DataKey *nkey;
  undefined8 in_stack_ffffffffffffff88;
  double dVar6;
  VectorBase<double> *in_stack_ffffffffffffff90;
  
  iVar1 = num((LPRowSetBase<double> *)0x27132d);
  iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x271342);
  if (iVar2 < iVar1 + 1) {
    num((LPRowSetBase<double> *)0x271366);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPRowSetBase<double> *)0x271392);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPRowSetBase<double> *)0x2713be);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPRowSetBase<double> *)0x2713ea);
    DataArray<int>::reSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  dVar6 = *in_RCX;
  this_00 = (VectorBase<double> *)(in_RDI + 0x68);
  num((LPRowSetBase<double> *)0x271421);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar6;
  nkey = (DataKey *)*in_R8;
  idxmax = (int)((ulong)(in_RDI + 0x80) >> 0x20);
  num((LPRowSetBase<double> *)0x271461);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = (double)nkey;
  dVar6 = *in_R9;
  this_01 = (SVSetBase<double> *)(in_RDI + 0x98);
  num((LPRowSetBase<double> *)0x27149e);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar6;
  iVar1 = *in_stack_00000008;
  this_02 = (DataArray<int> *)(in_RDI + 0xb0);
  iVar2 = num((LPRowSetBase<double> *)0x2714da);
  piVar4 = DataArray<int>::operator[](this_02,iVar2);
  *piVar4 = iVar1;
  pSVar5 = SVSetBase<double>::create(this_01,nkey,idxmax);
  return pSVar5;
}

Assistant:

SVectorBase<R>& create(DataKey& newkey, int nonzeros = 0, const R& newlhs = 0, const R& newrhs = 1,
                          const R& newobj = 0, const int& newscaleExp = 0)
   {
      if(num() + 1 > left.dim())
      {
         left.reDim(num() + 1);
         right.reDim(num() + 1);
         object.reDim(num() + 1);
         scaleExp.reSize(num() + 1);
      }

      left[num()] = newlhs;
      right[num()] = newrhs;
      object[num()] = newobj;
      scaleExp[num()] = newscaleExp;

      return *SVSetBase<R>::create(newkey, nonzeros);
   }